

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_tcp.cpp
# Opt level: O1

string * __thiscall
miniros::TransportTCP::getClientURI_abi_cxx11_(string *__return_storage_ptr__,TransportTCP *this)

{
  char *__src;
  size_t sVar1;
  ostream *this_00;
  ushort uVar2;
  string ip;
  socklen_t sas_len;
  char namebuf [128];
  sockaddr_storage sas;
  stringstream uri;
  long *local_2d0;
  long local_2c8;
  long local_2c0 [2];
  socklen_t local_2ac;
  char local_2a8 [128];
  undefined1 local_228 [8];
  undefined1 local_220 [120];
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  local_2ac = 0x80;
  getpeername(this->sock_,(sockaddr *)local_228,&local_2ac);
  local_2a8[0x70] = '\0';
  local_2a8[0x71] = '\0';
  local_2a8[0x72] = '\0';
  local_2a8[0x73] = '\0';
  local_2a8[0x74] = '\0';
  local_2a8[0x75] = '\0';
  local_2a8[0x76] = '\0';
  local_2a8[0x77] = '\0';
  local_2a8[0x78] = '\0';
  local_2a8[0x79] = '\0';
  local_2a8[0x7a] = '\0';
  local_2a8[0x7b] = '\0';
  local_2a8[0x7c] = '\0';
  local_2a8[0x7d] = '\0';
  local_2a8[0x7e] = '\0';
  local_2a8[0x7f] = '\0';
  local_2a8[0x60] = '\0';
  local_2a8[0x61] = '\0';
  local_2a8[0x62] = '\0';
  local_2a8[99] = '\0';
  local_2a8[100] = '\0';
  local_2a8[0x65] = '\0';
  local_2a8[0x66] = '\0';
  local_2a8[0x67] = '\0';
  local_2a8[0x68] = '\0';
  local_2a8[0x69] = '\0';
  local_2a8[0x6a] = '\0';
  local_2a8[0x6b] = '\0';
  local_2a8[0x6c] = '\0';
  local_2a8[0x6d] = '\0';
  local_2a8[0x6e] = '\0';
  local_2a8[0x6f] = '\0';
  local_2a8[0x50] = '\0';
  local_2a8[0x51] = '\0';
  local_2a8[0x52] = '\0';
  local_2a8[0x53] = '\0';
  local_2a8[0x54] = '\0';
  local_2a8[0x55] = '\0';
  local_2a8[0x56] = '\0';
  local_2a8[0x57] = '\0';
  local_2a8[0x58] = '\0';
  local_2a8[0x59] = '\0';
  local_2a8[0x5a] = '\0';
  local_2a8[0x5b] = '\0';
  local_2a8[0x5c] = '\0';
  local_2a8[0x5d] = '\0';
  local_2a8[0x5e] = '\0';
  local_2a8[0x5f] = '\0';
  local_2a8[0x40] = '\0';
  local_2a8[0x41] = '\0';
  local_2a8[0x42] = '\0';
  local_2a8[0x43] = '\0';
  local_2a8[0x44] = '\0';
  local_2a8[0x45] = '\0';
  local_2a8[0x46] = '\0';
  local_2a8[0x47] = '\0';
  local_2a8[0x48] = '\0';
  local_2a8[0x49] = '\0';
  local_2a8[0x4a] = '\0';
  local_2a8[0x4b] = '\0';
  local_2a8[0x4c] = '\0';
  local_2a8[0x4d] = '\0';
  local_2a8[0x4e] = '\0';
  local_2a8[0x4f] = '\0';
  local_2a8[0x30] = '\0';
  local_2a8[0x31] = '\0';
  local_2a8[0x32] = '\0';
  local_2a8[0x33] = '\0';
  local_2a8[0x34] = '\0';
  local_2a8[0x35] = '\0';
  local_2a8[0x36] = '\0';
  local_2a8[0x37] = '\0';
  local_2a8[0x38] = '\0';
  local_2a8[0x39] = '\0';
  local_2a8[0x3a] = '\0';
  local_2a8[0x3b] = '\0';
  local_2a8[0x3c] = '\0';
  local_2a8[0x3d] = '\0';
  local_2a8[0x3e] = '\0';
  local_2a8[0x3f] = '\0';
  local_2a8[0x20] = '\0';
  local_2a8[0x21] = '\0';
  local_2a8[0x22] = '\0';
  local_2a8[0x23] = '\0';
  local_2a8[0x24] = '\0';
  local_2a8[0x25] = '\0';
  local_2a8[0x26] = '\0';
  local_2a8[0x27] = '\0';
  local_2a8[0x28] = '\0';
  local_2a8[0x29] = '\0';
  local_2a8[0x2a] = '\0';
  local_2a8[0x2b] = '\0';
  local_2a8[0x2c] = '\0';
  local_2a8[0x2d] = '\0';
  local_2a8[0x2e] = '\0';
  local_2a8[0x2f] = '\0';
  local_2a8[0x10] = '\0';
  local_2a8[0x11] = '\0';
  local_2a8[0x12] = '\0';
  local_2a8[0x13] = '\0';
  local_2a8[0x14] = '\0';
  local_2a8[0x15] = '\0';
  local_2a8[0x16] = '\0';
  local_2a8[0x17] = '\0';
  local_2a8[0x18] = '\0';
  local_2a8[0x19] = '\0';
  local_2a8[0x1a] = '\0';
  local_2a8[0x1b] = '\0';
  local_2a8[0x1c] = '\0';
  local_2a8[0x1d] = '\0';
  local_2a8[0x1e] = '\0';
  local_2a8[0x1f] = '\0';
  local_2a8[0] = '\0';
  local_2a8[1] = '\0';
  local_2a8[2] = '\0';
  local_2a8[3] = '\0';
  local_2a8[4] = '\0';
  local_2a8[5] = '\0';
  local_2a8[6] = '\0';
  local_2a8[7] = '\0';
  local_2a8[8] = '\0';
  local_2a8[9] = '\0';
  local_2a8[10] = '\0';
  local_2a8[0xb] = '\0';
  local_2a8[0xc] = '\0';
  local_2a8[0xd] = '\0';
  local_2a8[0xe] = '\0';
  local_2a8[0xf] = '\0';
  if (local_228._0_2_ == 10) {
    uVar2 = local_228._2_2_ << 8 | (ushort)local_228._2_2_ >> 8;
    inet_ntop(10,local_220,local_2a8,0x80);
  }
  else if (local_228._0_2_ == 2) {
    uVar2 = local_228._2_2_ << 8 | (ushort)local_228._2_2_ >> 8;
    __src = inet_ntoa((in_addr)local_228._4_4_);
    strncpy(local_2a8,__src,0x7f);
  }
  else {
    local_2a8[0] = '\0';
    local_2a8[1] = '\0';
    local_2a8[2] = '\0';
    local_2a8[3] = '\0';
    local_2a8[4] = '\0';
    local_2a8[5] = '\0';
    local_2a8[6] = '\0';
    local_2a8[7] = '\0';
    uVar2 = 0;
  }
  local_2d0 = local_2c0;
  sVar1 = strlen(local_2a8);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,local_2a8,local_2a8 + sVar1);
  std::__cxx11::stringstream::stringstream(local_1a8);
  this_00 = std::__ostream_insert<char,std::char_traits<char>>
                      (local_198,(char *)local_2d0,local_2c8);
  std::__ostream_insert<char,std::char_traits<char>>(this_00,":",1);
  std::ostream::operator<<((ostream *)this_00,(uint)uVar2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  if (local_2d0 != local_2c0) {
    operator_delete(local_2d0,local_2c0[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TransportTCP::getClientURI()
{
  MINIROS_ASSERT(!is_server_);

  sockaddr_storage sas;
  socklen_t sas_len = sizeof(sas);
  getpeername(sock_, (sockaddr *)&sas, &sas_len);
  
  sockaddr_in *sin = (sockaddr_in *)&sas;
  sockaddr_in6 *sin6 = (sockaddr_in6 *)&sas;

  char namebuf[128] = {};
  int port;

  switch (sas.ss_family)
  {
    case AF_INET:
      port = ntohs(sin->sin_port);
      strncpy(namebuf, inet_ntoa(sin->sin_addr), sizeof(namebuf)-1);
      break;
    case AF_INET6:
      port = ntohs(sin6->sin6_port);
      inet_ntop(AF_INET6, (void*)&(sin6->sin6_addr), namebuf, sizeof(namebuf));
      break;
    default:
      namebuf[0] = 0;
      port = 0;
      break;
  }

  std::string ip = namebuf;
  std::stringstream uri;
  uri << ip << ":" << port;

  return uri.str();
}